

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QWellArray::setSelected(QWellArray *this,int row,int col)

{
  int column;
  undefined1 auVar1 [16];
  long lVar2;
  int iVar3;
  long in_FS_OFFSET;
  int local_50;
  int local_4c;
  QRect local_48;
  int *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = this->selRow;
  column = this->selCol;
  if ((col | row) < 0) {
    col = -1;
    row = -1;
  }
  this->selCol = col;
  this->selRow = row;
  local_48 = cellGeometry(this,iVar3,column);
  QWidget::update(&this->super_QWidget,&local_48);
  local_48 = cellGeometry(this,this->selRow,this->selCol);
  QWidget::update(&this->super_QWidget,&local_48);
  if (-1 < row) {
    local_38 = &local_50;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &local_4c;
    local_48 = (QRect)(auVar1 << 0x40);
    local_50 = col;
    local_4c = row;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_48);
  }
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
    iVar3 = (int)*(undefined8 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar2 != 0) {
      QWidget::close(*(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10),iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWellArray::setSelected(int row, int col)
{
    int oldRow = selRow;
    int oldCol = selCol;

    if (row < 0 || col < 0)
        row = col = -1;

    selCol = col;
    selRow = row;

    updateCell(oldRow, oldCol);
    updateCell(selRow, selCol);
    if (row >= 0)
        emit selected(row, col);

#if QT_CONFIG(menu)
    if (isVisible() && qobject_cast<QMenu*>(parentWidget()))
        parentWidget()->close();
#endif
}